

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

int Extra_bddSuppDifferentVars(DdManager *dd,DdNode *S1,DdNode *S2,int DiffMax)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = S1->index;
  iVar4 = 0;
  if (uVar3 != 0x7fffffff) {
    iVar2 = 1;
    if (1 < DiffMax) {
      iVar2 = DiffMax;
    }
    iVar4 = 0;
    do {
      uVar1 = S2->index;
      if ((ulong)uVar1 == 0x7fffffff) goto LAB_0080e568;
      if (uVar3 == uVar1) {
        S1 = (S1->type).kids.T;
        S2 = (S2->type).kids.T;
        uVar3 = S1->index;
      }
      else {
        if (iVar4 == iVar2 + -1) {
          return DiffMax;
        }
        if (dd->perm[uVar3] < dd->perm[uVar1]) {
          S1 = (S1->type).kids.T;
          uVar3 = S1->index;
        }
        else {
          S2 = (S2->type).kids.T;
        }
        iVar4 = iVar4 + 1;
      }
    } while (uVar3 != 0x7fffffff);
  }
  S1 = S2;
  if (S2->index != 0x7fffffff) {
LAB_0080e568:
    iVar2 = Extra_bddSuppSize(dd,S1);
    iVar4 = iVar4 + iVar2;
  }
  if (iVar4 < DiffMax) {
    DiffMax = iVar4;
  }
  return DiffMax;
}

Assistant:

int Extra_bddSuppDifferentVars( DdManager * dd, DdNode * S1, DdNode * S2, int DiffMax )
{
    int Result = 0;
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, this var is the same
        if ( S1->index == S2->index )
        {
            S1 = cuddT(S1);
            S2 = cuddT(S2);
            continue;
        }
        // the top var is different
        Result++;

        if ( Result >= DiffMax )
            return DiffMax;

        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }

    // consider the remaining variables
    if ( S1->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S1);
    else if ( S2->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S2);

    if ( Result >= DiffMax )
        return DiffMax;
    return Result;
}